

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgscon.c
# Opt level: O1

void cgscon(char *norm,SuperMatrix *L,SuperMatrix *U,float anorm,float *rcond,SuperLUStat_t *stat,
           int *info)

{
  byte bVar1;
  int *info_00;
  SuperLUStat_t *stat_00;
  singlecomplex *x;
  char *diag;
  char *trans;
  int iVar2;
  char *uplo;
  int kase;
  float ainvnm;
  int *local_158;
  float local_150;
  int nrow;
  SuperLUStat_t *local_148;
  float *local_140;
  int isave [3];
  
  *info = 0;
  bVar1 = *norm;
  iVar2 = -1;
  if ((bVar1 - 0x31 < 0x1f) && ((0x41000001U >> (bVar1 - 0x31 & 0x1f) & 1) != 0)) {
    iVar2 = -2;
    if ((-1 < L->nrow) &&
       ((((L->nrow == L->ncol && (L->Stype == SLU_SC)) && (L->Dtype == SLU_C)) &&
        (L->Mtype == SLU_TRLU)))) {
      iVar2 = -3;
      if ((((-1 < U->nrow) && (U->nrow == U->ncol)) && (U->Stype == SLU_NC)) &&
         ((U->Dtype == SLU_C && (U->Mtype == SLU_TRU)))) goto LAB_00103c78;
    }
  }
  *info = iVar2;
LAB_00103c78:
  local_158 = info;
  local_148 = stat;
  if (*info == 0) {
    *rcond = 0.0;
    if (((long)L->nrow == 0) || (U->nrow == 0)) {
      *rcond = 1.0;
    }
    else {
      local_150 = anorm;
      local_140 = rcond;
      x = singlecomplexCalloc((long)L->nrow * 3);
      if (x == (singlecomplex *)0x0) {
        sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work arrays in cgscon."
                ,0x7f,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgscon.c")
        ;
        superlu_abort_and_exit((char *)isave);
      }
      ainvnm = 0.0;
      kase = 0;
      nrow = L->nrow;
      do {
        clacon2_(&nrow,x + L->nrow,x,&ainvnm,&kase,isave);
        stat_00 = local_148;
        info_00 = local_158;
        if (kase == 0) break;
        if (kase == 2 - (uint)(bVar1 == 0x31 || bVar1 == 0x4f)) {
          sp_ctrsv("L","No trans","Unit",L,U,x,local_148,local_158);
          uplo = "U";
          trans = "No trans";
          diag = "Non-unit";
        }
        else {
          sp_ctrsv("U","Transpose","Non-unit",L,U,x,local_148,local_158);
          uplo = "L";
          trans = "Transpose";
          diag = "Unit";
        }
        sp_ctrsv(uplo,trans,diag,L,U,x,stat_00,info_00);
      } while (kase != 0);
      if ((ainvnm != 0.0) || (NAN(ainvnm))) {
        *local_140 = (1.0 / ainvnm) / local_150;
      }
      superlu_free(x);
    }
  }
  else {
    isave[0] = -*info;
    input_error("cgscon",isave);
  }
  return;
}

Assistant:

void
cgscon(char *norm, SuperMatrix *L, SuperMatrix *U,
       float anorm, float *rcond, SuperLUStat_t *stat, int *info)
{


    /* Local variables */
    int    kase, kase1, onenrm;
    float ainvnm;
    singlecomplex *work;
    int    isave[3];
    extern int crscl_(int *, singlecomplex *, singlecomplex *, int *);

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    
    /* Test the input parameters. */
    *info = 0;
    onenrm = *(unsigned char *)norm == '1' || strncmp(norm, "O", 1)==0;
    if (! onenrm && strncmp(norm, "I", 1)!=0) *info = -1;
    else if (L->nrow < 0 || L->nrow != L->ncol ||
             L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU)
	 *info = -2;
    else if (U->nrow < 0 || U->nrow != U->ncol ||
             U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU) 
	*info = -3;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgscon", &ii);
	return;
    }

    /* Quick return if possible */
    *rcond = 0.;
    if ( L->nrow == 0 || U->nrow == 0) {
	*rcond = 1.;
	return;
    }

    work = singlecomplexCalloc( 3*L->nrow );


    if ( !work )
	ABORT("Malloc fails for work arrays in cgscon.");
    
    /* Estimate the norm of inv(A). */
    ainvnm = 0.;
    if ( onenrm ) kase1 = 1;
    else kase1 = 2;
    kase = 0;

    int nrow = L->nrow;

    do {
	clacon2_(&nrow, &work[L->nrow], &work[0], &ainvnm, &kase, isave);

	if (kase == 0) break;

	if (kase == kase1) {
	    /* Multiply by inv(L). */
	    sp_ctrsv("L", "No trans", "Unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(U). */
	    sp_ctrsv("U", "No trans", "Non-unit", L, U, &work[0], stat, info);
	    
	} else {

	    /* Multiply by inv(U'). */
	    sp_ctrsv("U", "Transpose", "Non-unit", L, U, &work[0], stat, info);

	    /* Multiply by inv(L'). */
	    sp_ctrsv("L", "Transpose", "Unit", L, U, &work[0], stat, info);
	    
	}

    } while ( kase != 0 );

    /* Compute the estimate of the reciprocal condition number. */
    if (ainvnm != 0.) *rcond = (1. / ainvnm) / anorm;

    SUPERLU_FREE (work);
    return;

}